

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::AggressiveDCEPass::GetLoadedVariables
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          AggressiveDCEPass *this,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  
  if (inst->opcode_ == OpFunctionCall) {
    GetLoadedVariablesFromFunctionCall(__return_storage_ptr__,this,inst);
  }
  else {
    uVar1 = GetLoadedVariableFromNonFunctionCalls(this,inst);
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar1 != 0) {
      puVar2 = (uint32_t *)operator_new(4);
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar2;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2 + 1;
      *puVar2 = uVar1;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = puVar2 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> AggressiveDCEPass::GetLoadedVariables(Instruction* inst) {
  if (inst->opcode() == spv::Op::OpFunctionCall) {
    return GetLoadedVariablesFromFunctionCall(inst);
  }
  uint32_t var_id = GetLoadedVariableFromNonFunctionCalls(inst);
  if (var_id == 0) {
    return {};
  }
  return {var_id};
}